

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

int __thiscall QSocks5SocketEngine::option(QSocks5SocketEngine *this,SocketOption option)

{
  QTcpSocket *pQVar1;
  QSocks5SocketEnginePrivate *pQVar2;
  int in_ESI;
  long in_FS_OFFSET;
  QSocks5SocketEnginePrivate *d;
  int local_4c;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QSocks5SocketEngine *)0x374ac9);
  if ((pQVar2->data != (QSocks5Data *)0x0) && (pQVar2->data->controlSocket != (QTcpSocket *)0x0)) {
    if (in_ESI == 7) {
      pQVar1 = pQVar2->data->controlSocket;
      (**(code **)(*(long *)&pQVar1->super_QAbstractSocket + 0x128))(&local_28,pQVar1,0);
      local_4c = QVariant::toInt((bool *)&local_28);
      QVariant::~QVariant(&local_28);
      goto LAB_00374b8c;
    }
    if (in_ESI == 8) {
      pQVar1 = pQVar2->data->controlSocket;
      (**(code **)(*(long *)&pQVar1->super_QAbstractSocket + 0x128))(&local_48,pQVar1,1);
      local_4c = QVariant::toInt((bool *)&local_48);
      QVariant::~QVariant(&local_48);
      goto LAB_00374b8c;
    }
  }
  local_4c = -1;
LAB_00374b8c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_4c;
}

Assistant:

int QSocks5SocketEngine::option(SocketOption option) const
{
    Q_D(const QSocks5SocketEngine);
    if (d->data && d->data->controlSocket) {
        // convert the enum and call the real socket
        if (option == QAbstractSocketEngine::LowDelayOption)
            return d->data->controlSocket->socketOption(QAbstractSocket::LowDelayOption).toInt();
        if (option == QAbstractSocketEngine::KeepAliveOption)
            return d->data->controlSocket->socketOption(QAbstractSocket::KeepAliveOption).toInt();
    }
    return -1;
}